

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemTooBig(Mem *p)

{
  int iVar1;
  
  if ((p->flags & 0x12) != 0) {
    iVar1 = p->n;
    if ((p->flags >> 0xe & 1) != 0) {
      iVar1 = iVar1 + (p->u).nZero;
    }
    return (int)(p->db->aLimit[0] < iVar1);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemTooBig(Mem *p){
  assert( p->db!=0 );
  if( p->flags & (MEM_Str|MEM_Blob) ){
    int n = p->n;
    if( p->flags & MEM_Zero ){
      n += p->u.nZero;
    }
    return n>p->db->aLimit[SQLITE_LIMIT_LENGTH];
  }
  return 0; 
}